

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestGroupStats::~TestGroupStats(TestGroupStats *this)

{
  void *in_RDI;
  
  ~TestGroupStats((TestGroupStats *)0x18e4a8);
  operator_delete(in_RDI,0x70);
  return;
}

Assistant:

TestGroupStats::~TestGroupStats() {}